

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

Edge * __thiscall Plan::FindWork(Plan *this)

{
  bool bVar1;
  reference ppEVar2;
  Edge *edge;
  iterator e;
  Plan *this_local;
  
  e._M_node = (_Base_ptr)this;
  bVar1 = std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::empty(&this->ready_);
  if (bVar1) {
    this_local = (Plan *)0x0;
  }
  else {
    edge = (Edge *)std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::begin
                             (&this->ready_);
    ppEVar2 = std::_Rb_tree_const_iterator<Edge_*>::operator*
                        ((_Rb_tree_const_iterator<Edge_*> *)&edge);
    this_local = (Plan *)*ppEVar2;
    std::set<Edge*,std::less<Edge*>,std::allocator<Edge*>>::erase_abi_cxx11_
              ((set<Edge*,std::less<Edge*>,std::allocator<Edge*>> *)&this->ready_,
               (const_iterator)edge);
  }
  return (Edge *)this_local;
}

Assistant:

Edge* Plan::FindWork() {
  if (ready_.empty())
    return NULL;
  set<Edge*>::iterator e = ready_.begin();
  Edge* edge = *e;
  ready_.erase(e);
  return edge;
}